

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.h
# Opt level: O0

void __thiscall libchars::command::~command(command *this)

{
  command *this_00;
  command *this_local;
  
  this_00 = this->next;
  if (this_00 != (command *)0x0) {
    ~command(this_00);
    operator_delete(this_00,0x98);
  }
  std::vector<libchars::parameter,_std::allocator<libchars::parameter>_>::~vector(&this->par);
  std::__cxx11::string::~string((string *)&this->help);
  std::__cxx11::string::~string((string *)&this->cmd_str);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~command() { delete next; }